

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O2

ItemThing * get_list_item(list<ItemThing_*,_std::allocator<ItemThing_*>_> *l,int i)

{
  _List_node_base *p_Var1;
  int iVar2;
  
  iVar2 = i + 1;
  p_Var1 = (_List_node_base *)l;
  do {
    p_Var1 = (((_List_base<ItemThing_*,_std::allocator<ItemThing_*>_> *)&p_Var1->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    if (p_Var1 == (_List_node_base *)l) {
      return (ItemThing *)0x0;
    }
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  return (ItemThing *)p_Var1[1]._M_next;
}

Assistant:

static ItemThing* get_list_item(std::list<ItemThing*>& l, int i)
{
    int count = 0;
    for(ItemThing* obj : l)
    {
        if (count == i)
            return obj;
        count++;
    }
    return(nullptr);
}